

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O2

void __thiscall CIdExp::CIdExp(CIdExp *this,char *name)

{
  allocator local_31;
  string local_30 [32];
  
  (this->super_IExpression).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_0017a1a0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->isInstance = false;
  std::__cxx11::string::string(local_30,name,&local_31);
  std::__cxx11::string::operator=((string *)&this->name,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

CIdExp::CIdExp( char *name) {
    this->name = std::string( name );
}